

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode pausewrite(Curl_easy *data,int type,char *ptr,size_t len)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  CURLcode CVar4;
  uint uVar5;
  uint uVar6;
  CURLcode CVar7;
  ulong uVar8;
  
  Curl_http2_stream_pause(data,true);
  uVar3 = (data->state).tempcount;
  if (uVar3 == 0) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    while ((uVar6 = uVar3, uVar3 != uVar5 &&
           (uVar6 = uVar5, (data->state).tempwrite[uVar5].type != type))) {
      uVar5 = uVar5 + 1;
    }
    if (2 < uVar6) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (uVar5 < uVar3) {
      uVar8 = (ulong)uVar6;
      goto LAB_0042fae5;
    }
  }
  uVar8 = (ulong)uVar6;
  Curl_dyn_init(&(data->state).tempwrite[uVar8].b,0x4000000);
  (data->state).tempwrite[uVar8].type = type;
  puVar1 = &(data->state).tempcount;
  *puVar1 = *puVar1 + 1;
LAB_0042fae5:
  CVar7 = CURLE_OUT_OF_MEMORY;
  CVar4 = Curl_dyn_addn(&(data->state).tempwrite[uVar8].b,ptr,len);
  if (CVar4 == CURLE_OK) {
    piVar2 = &(data->req).keepon;
    *(byte *)piVar2 = (byte)*piVar2 | 0x10;
    CVar7 = CURLE_OK;
  }
  return CVar7;
}

Assistant:

static CURLcode pausewrite(struct Curl_easy *data,
                           int type, /* what type of data */
                           const char *ptr,
                           size_t len)
{
  /* signalled to pause sending on this connection, but since we have data
     we want to send we need to dup it to save a copy for when the sending
     is again enabled */
  struct SingleRequest *k = &data->req;
  struct UrlState *s = &data->state;
  unsigned int i;
  bool newtype = TRUE;

  /* If this transfers over HTTP/2, pause the stream! */
  Curl_http2_stream_pause(data, TRUE);

  if(s->tempcount) {
    for(i = 0; i< s->tempcount; i++) {
      if(s->tempwrite[i].type == type) {
        /* data for this type exists */
        newtype = FALSE;
        break;
      }
    }
    DEBUGASSERT(i < 3);
    if(i >= 3)
      /* There are more types to store than what fits: very bad */
      return CURLE_OUT_OF_MEMORY;
  }
  else
    i = 0;

  if(newtype) {
    /* store this information in the state struct for later use */
    Curl_dyn_init(&s->tempwrite[i].b, DYN_PAUSE_BUFFER);
    s->tempwrite[i].type = type;
    s->tempcount++;
  }

  if(Curl_dyn_addn(&s->tempwrite[i].b, (unsigned char *)ptr, len))
    return CURLE_OUT_OF_MEMORY;

  /* mark the connection as RECV paused */
  k->keepon |= KEEP_RECV_PAUSE;

  return CURLE_OK;
}